

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_stream_get_position(cubeb_stream_conflict *stm,uint64_t *position)

{
  size_t sVar1;
  size_t sVar2;
  ulong *in_RSI;
  long *in_RDI;
  uint64_t bytes;
  pa_usec_t r_usec;
  int in_thread;
  int r;
  pa_usec_t local_28;
  int local_20;
  int local_1c;
  ulong *local_18;
  long *local_10;
  int local_4;
  
  if ((in_RDI == (long *)0x0) || (in_RDI[2] == 0)) {
    local_4 = -1;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_20 = (*cubeb_pa_threaded_mainloop_in_thread)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
    if (local_20 == 0) {
      (*cubeb_pa_threaded_mainloop_lock)(*(pa_threaded_mainloop **)(*local_10 + 0x10));
    }
    local_1c = (*cubeb_pa_stream_get_time)((pa_stream *)local_10[2],&local_28);
    if (local_20 == 0) {
      (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)(*local_10 + 0x10));
    }
    if (local_1c == 0) {
      sVar1 = (*cubeb_pa_usec_to_bytes)(local_28,(pa_sample_spec *)(local_10 + 7));
      sVar2 = (*cubeb_pa_frame_size)((pa_sample_spec *)(local_10 + 7));
      *local_18 = sVar1 / sVar2;
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int
pulse_stream_get_position(cubeb_stream * stm, uint64_t * position)
{
  int r, in_thread;
  pa_usec_t r_usec;
  uint64_t bytes;

  if (!stm || !stm->output_stream) {
    return CUBEB_ERROR;
  }

  in_thread = WRAP(pa_threaded_mainloop_in_thread)(stm->context->mainloop);

  if (!in_thread) {
    WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
  }
  r = WRAP(pa_stream_get_time)(stm->output_stream, &r_usec);
  if (!in_thread) {
    WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);
  }

  if (r != 0) {
    return CUBEB_ERROR;
  }

  bytes = WRAP(pa_usec_to_bytes)(r_usec, &stm->output_sample_spec);
  *position = bytes / WRAP(pa_frame_size)(&stm->output_sample_spec);

  return CUBEB_OK;
}